

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::image_atomic_exchange
               (NegativeTestContext *ctx,TextureType imageType)

{
  MemoryQualifier memory;
  long lVar1;
  int memoryNdx;
  long lVar2;
  string local_b8;
  TextureFormat local_98 [10];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  local_98[0].order = RGBA;
  local_98[0].type = FLOAT;
  local_98[1].order = RGBA;
  local_98[1].type = HALF_FLOAT;
  local_98[2].order = R;
  local_98[2].type = FLOAT;
  local_98[3].order = RGBA;
  local_98[3].type = UNORM_INT8;
  local_98[4].order = RGBA;
  local_98[4].type = SNORM_INT8;
  local_98[5].order = RGBA;
  local_98[5].type = SIGNED_INT32;
  local_98[6].order = RGBA;
  local_98[6].type = SIGNED_INT16;
  local_98[7].order = RGBA;
  local_98[7].type = SIGNED_INT8;
  local_98[8].order = R;
  local_98[8].type = SIGNED_INT32;
  local_98[9].order = RGBA;
  local_98[9].type = UNSIGNED_INT32;
  local_48 = 8;
  uStack_44 = 0x1f;
  uStack_40 = 8;
  uStack_3c = 0x1e;
  local_38 = 0x2100000000;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "It is an error to pass a writeonly and/or readonly image to imageAtomic*.","");
  NegativeTestContext::beginSection(ctx,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  lVar2 = 0;
  do {
    memory = (&DAT_0099e3dc)[lVar2];
    lVar1 = 0;
    do {
      testShader(ctx,IMAGE_OPERATION_ATOMIC_EXCHANGE,memory,imageType,
                 (TextureFormat *)((long)&local_98[0].order + lVar1));
      lVar1 = lVar1 + 8;
    } while (lVar1 != 0x68);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void image_atomic_exchange (NegativeTestContext& ctx, glu::TextureTestUtil::TextureType imageType)
{
	const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::HALF_FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::FLOAT),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SNORM_INT8),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::SIGNED_INT32),

		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNSIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::R,		tcu::TextureFormat::UNSIGNED_INT32)
	};

	const MemoryQualifier memoryOptions[] =
	{
		MEMORY_READONLY,
		MEMORY_WRITEONLY,
		MEMORY_BOTH
	};

	ctx.beginSection("It is an error to pass a writeonly and/or readonly image to imageAtomic*.");
	for (int memoryNdx = 0; memoryNdx < DE_LENGTH_OF_ARRAY(memoryOptions); ++memoryNdx)
	{
		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(formats); ++fmtNdx)
		{
			testShader(ctx, IMAGE_OPERATION_ATOMIC_EXCHANGE, memoryOptions[memoryNdx], imageType, formats[fmtNdx]);
		}
	}
	ctx.endSection();
}